

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::transposeTransitionMatrices
          (BeagleCPUImpl<double,_1,_1> *this,int *inputIndices,int *resultIndices,int matrixCount)

{
  int j;
  int i;
  int l;
  double *C;
  double *A;
  int u;
  int returnCode;
  int matrixCount_local;
  int *resultIndices_local;
  int *inputIndices_local;
  BeagleCPUImpl<double,_1,_1> *this_local;
  
  u = 0;
  while( true ) {
    if (matrixCount <= u) {
      return 0;
    }
    if (inputIndices[u] == resultIndices[u]) break;
    A = this->gTransitionMatrices[inputIndices[u]];
    C = this->gTransitionMatrices[resultIndices[u]];
    for (l = 0; l < this->kCategoryCount; l = l + 1) {
      for (i = 0; i < this->kStateCount; i = i + 1) {
        for (j = 0; j < this->kStateCount; j = j + 1) {
          C[this->kTransPaddedStateCount * j + i] = A[this->kTransPaddedStateCount * i + j];
        }
      }
      A = A + this->kStateCount * this->kTransPaddedStateCount;
      C = C + this->kStateCount * this->kTransPaddedStateCount;
    }
    u = u + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::transposeTransitionMatrices(
        const int* inputIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if (inputIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place transpose is not allowed.\n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }

        REALTYPE* A = gTransitionMatrices[inputIndices[u]];
        REALTYPE* C = gTransitionMatrices[resultIndices[u]];

        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    C[kTransPaddedStateCount * j + i] = A[kTransPaddedStateCount * i + j];

                }
            }

            A += kStateCount * kTransPaddedStateCount;
            C += kStateCount * kTransPaddedStateCount;
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    return returnCode;
}